

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O3

void __thiscall QEglFSKmsGbmScreen::flip(QEglFSKmsGbmScreen *this)

{
  QEglFSKmsGbmScreen *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  gbm_bo *bo;
  FrameBuffer *pFVar5;
  drmModeAtomicReq *pdVar6;
  iterator iVar7;
  iterator iVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  QArrayData *local_98;
  longlong local_90;
  QArrayData *local_80;
  undefined8 *local_78;
  QArrayData *local_68;
  longlong local_60;
  QArrayData *local_50;
  undefined8 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->field_0x228 != '\0') goto LAB_00113c30;
  if (this->m_cloneSource != (QEglFSKmsGbmScreen *)0x0) {
    flip(this);
    goto LAB_00113c30;
  }
  if (this->m_gbm_surface == (gbm_surface *)0x0) {
    flip();
    goto LAB_00113c30;
  }
  bo = (gbm_bo *)gbm_surface_lock_front_buffer();
  this->m_gbm_bo_next = bo;
  if (bo == (gbm_bo *)0x0) {
    flip(this);
    goto LAB_00113c30;
  }
  pFVar5 = framebufferForBufferObject(this,bo);
  if (pFVar5 == (FrameBuffer *)0x0) {
    flip();
  }
  else {
    ensureModeSet(this,pFVar5->fb);
    iVar3 = QKmsDevice::fd(*(QKmsDevice **)&this->field_0x28);
    this->m_flipPending = true;
    bVar2 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
    if (bVar2) {
      pdVar6 = QKmsDevice::threadLocalAtomicRequest(*(QKmsDevice **)&this->field_0x28);
      if (pdVar6 != (drmModeAtomicReq *)0x0) {
        addAtomicFlip(pdVar6,(QKmsOutput *)&this->field_0x30,pFVar5->fb);
        if (flip()::zpos == '\0') {
          flip();
        }
        if (flip::zpos != 0) {
          drmModeAtomicAddProperty
                    (pdVar6,**(undefined4 **)&this->field_0xf8,
                     (*(undefined4 **)&this->field_0xf8)[0x17]);
        }
        if (flip()::blendOp == '\0') {
          flip();
        }
        if (flip::blendOp != 0) {
          drmModeAtomicAddProperty
                    (pdVar6,**(undefined4 **)&this->field_0xf8,
                     (*(undefined4 **)&this->field_0xf8)[0x18]);
        }
      }
    }
    else {
      iVar4 = drmModePageFlip(iVar3,*(undefined4 *)&this->field_0x50,pFVar5->fb,1,this);
      if (iVar4 != 0) {
        flip(this);
        goto LAB_00113c0b;
      }
    }
    iVar7 = QList<QEglFSKmsGbmScreen::CloneDestination>::begin(&this->m_cloneDests);
    iVar8 = QList<QEglFSKmsGbmScreen::CloneDestination>::end(&this->m_cloneDests);
    for (; iVar7.i != iVar8.i; iVar7.i = iVar7.i + 1) {
      if ((iVar7.i)->screen != this) {
        ensureModeSet((iVar7.i)->screen,pFVar5->fb);
        (iVar7.i)->cloneFlipPending = true;
        pQVar1 = (iVar7.i)->screen;
        bVar2 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
        if (bVar2) {
          pdVar6 = QKmsDevice::threadLocalAtomicRequest(*(QKmsDevice **)&this->field_0x28);
          if (pdVar6 != (drmModeAtomicReq *)0x0) {
            addAtomicFlip(pdVar6,(QKmsOutput *)&pQVar1->field_0x30,pFVar5->fb);
          }
        }
        else {
          iVar4 = drmModePageFlip(iVar3,*(undefined4 *)&pQVar1->field_0x50,pFVar5->fb,1,
                                  (iVar7.i)->screen);
          if (iVar4 != 0) {
            (**(code **)(*(long *)(iVar7.i)->screen + 0x90))(&local_68);
            QString::toLocal8Bit_helper((QChar *)&local_50,local_60);
            puVar10 = local_48;
            if (local_48 == (undefined8 *)0x0) {
              puVar10 = &QByteArray::_empty;
            }
            (**(code **)(*(long *)this + 0x90))(&local_98,this);
            QString::toLocal8Bit_helper((QChar *)&local_80,local_90);
            puVar9 = local_78;
            if (local_78 == (undefined8 *)0x0) {
              puVar9 = &QByteArray::_empty;
            }
            qErrnoWarning("Could not queue DRM page flip for screen %s (clones screen %s)",puVar10,
                          puVar9);
            if (local_80 != (QArrayData *)0x0) {
              LOCK();
              (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_80,1,0x10);
              }
            }
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,0x10);
              }
            }
            if (local_50 != (QArrayData *)0x0) {
              LOCK();
              (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50,1,0x10);
              }
            }
            if (local_68 != (QArrayData *)0x0) {
              LOCK();
              (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_68,2,0x10);
              }
            }
            (iVar7.i)->cloneFlipPending = false;
          }
        }
      }
    }
    bVar2 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
    if ((!bVar2) ||
       (bVar2 = QKmsDevice::threadLocalAtomicCommit(*(QKmsDevice **)&this->field_0x28,this), bVar2))
    goto LAB_00113c30;
  }
LAB_00113c0b:
  this->m_flipPending = false;
  gbm_surface_release_buffer(this->m_gbm_surface,this->m_gbm_bo_next);
  this->m_gbm_bo_next = (gbm_bo *)0x0;
LAB_00113c30:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmScreen::flip()
{
    // For headless screen just return silently. It is not necessarily an error
    // to end up here, so show no warnings.
    if (m_headless)
        return;

    if (m_cloneSource) {
        qWarning("Screen %s clones another screen. swapBuffers() not allowed.", qPrintable(name()));
        return;
    }

    if (!m_gbm_surface) {
        qWarning("Cannot sync before platform init!");
        return;
    }

    m_gbm_bo_next = gbm_surface_lock_front_buffer(m_gbm_surface);
    if (!m_gbm_bo_next) {
        qWarning("Could not lock GBM surface front buffer for screen %s", qPrintable(name()));
        return;
    }

    auto gbmRelease = qScopeGuard([this]{
        m_flipPending = false;
        gbm_surface_release_buffer(m_gbm_surface, m_gbm_bo_next);
        m_gbm_bo_next = nullptr;
    });

    FrameBuffer *fb = framebufferForBufferObject(m_gbm_bo_next);
    if (!fb) {
        qWarning("FrameBuffer not available. Cannot flip");
        return;
    }
    ensureModeSet(fb->fb);

    const QKmsOutput &thisOutput(output());
    const int fd = device()->fd();
    m_flipPending = true;

    if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
        drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
        if (request) {
            addAtomicFlip(request, thisOutput, fb->fb);
            static int zpos = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ZPOS");
            if (zpos) {
                drmModeAtomicAddProperty(request, thisOutput.eglfs_plane->id,
                                         thisOutput.eglfs_plane->zposPropertyId, zpos);
            }
            static uint blendOp = uint(qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_BLEND_OP"));
            if (blendOp) {
                drmModeAtomicAddProperty(request, thisOutput.eglfs_plane->id,
                                         thisOutput.eglfs_plane->blendOpPropertyId, blendOp);
            }
        }
#endif
    } else {
        int ret = drmModePageFlip(fd,
                                  thisOutput.crtc_id,
                                  fb->fb,
                                  DRM_MODE_PAGE_FLIP_EVENT,
                                  this);
        if (ret) {
            qErrnoWarning("Could not queue DRM page flip on screen %s", qPrintable(name()));
            return;
        }
    }

    for (CloneDestination &d : m_cloneDests) {
        if (d.screen != this) {
            d.screen->ensureModeSet(fb->fb);
            d.cloneFlipPending = true;
            const QKmsOutput &destOutput(d.screen->output());

            if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
                drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
                if (request)
                    addAtomicFlip(request, destOutput, fb->fb);

                // ### This path is broken. On the other branch we can easily
                // pass in d.screen as the user_data for drmModePageFlip, but
                // using one atomic request breaks down here since we get events
                // with the same user_data passed to drmModeAtomicCommit.  Until
                // this gets reworked (multiple requests?) screen cloning is not
                // compatible with atomic.
#endif
            } else {
                int ret = drmModePageFlip(fd,
                                          destOutput.crtc_id,
                                          fb->fb,
                                          DRM_MODE_PAGE_FLIP_EVENT,
                                          d.screen);
                if (ret) {
                    qErrnoWarning("Could not queue DRM page flip for screen %s (clones screen %s)",
                                  qPrintable(d.screen->name()),
                                  qPrintable(name()));
                    d.cloneFlipPending = false;
                }
            }
        }
    }

    if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
        if (!device()->threadLocalAtomicCommit(this)) {
            return;
        }
#endif
    }

    gbmRelease.dismiss();
}